

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-get-attr.c
# Opt level: O0

void print_attr(BigAttr *attr,int brief)

{
  int iVar1;
  char *local_b0;
  char *endl;
  char *pcStack_a0;
  int i;
  char *data;
  char buffer [128];
  int brief_local;
  BigAttr *attr_local;
  
  pcStack_a0 = attr->data;
  buffer._124_4_ = brief;
  if ((brief == 0) || (longfmt != 0)) {
    printf("%-20s %s %3d  ",attr->name,attr->dtype,(ulong)(uint)attr->nmemb);
    printf("[ ");
  }
  for (endl._4_4_ = 0; endl._4_4_ < attr->nmemb; endl._4_4_ = endl._4_4_ + 1) {
    if ((endl._4_4_ == attr->nmemb + -1) || (attr->dtype[1] == 'S')) {
      local_b0 = "";
    }
    else {
      local_b0 = " ";
    }
    big_file_dtype_format((char *)&data,attr->dtype,pcStack_a0,(char *)0x0);
    printf("%s%s",&data,local_b0);
    iVar1 = big_file_dtype_itemsize(attr->dtype);
    pcStack_a0 = pcStack_a0 + iVar1;
  }
  if ((buffer._124_4_ == 0) || (longfmt != 0)) {
    printf(" ]");
  }
  printf("\n");
  return;
}

Assistant:

static void print_attr(BigAttr * attr, int brief) {
    char buffer[128];
    char * data = attr->data;
    int i;
    if(!brief || longfmt) {
        printf("%-20s %s %3d  ", attr->name, attr->dtype, attr->nmemb);
        printf("[ ");
    }
    for(i = 0; i < attr->nmemb; i ++) {
        char * endl;
        if(i != attr->nmemb - 1 && attr->dtype[1] != 'S') {
            endl = " ";
        } else {
            endl = "";
        }
        big_file_dtype_format(buffer, attr->dtype, data, NULL);
        printf("%s%s", buffer, endl);
        data += dtype_itemsize(attr->dtype);
    }
    if(!brief || longfmt) {
        printf(" ]");
    }
    printf("\n");
}